

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_xml_lite.cpp
# Opt level: O2

Tag * Omega_h::xml_lite::read_tag(Tag *__return_storage_ptr__,istream *stream)

{
  bool bVar1;
  string line;
  
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  std::getline<char,std::char_traits<char>,std::allocator<char>>(stream,(string *)&line);
  Tag::Tag(__return_storage_ptr__);
  bVar1 = parse_tag(&line,__return_storage_ptr__);
  if (bVar1) {
    std::__cxx11::string::~string((string *)&line);
    return __return_storage_ptr__;
  }
  fail("assertion %s failed at %s +%d\n","check",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_xml_lite.cpp"
       ,0x6b);
}

Assistant:

xml_lite::Tag read_tag(std::istream& stream) {
  std::string line;
  std::getline(stream, line);
  xml_lite::Tag st;
  auto check = parse_tag(line, &st);
  OMEGA_H_CHECK(check);
  return st;
}